

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

void __thiscall QSQLiteResult::~QSQLiteResult(QSQLiteResult *this)

{
  QSQLiteResultPrivate *this_00;
  QSQLiteDriverPrivate *pQVar1;
  EVP_PKEY_CTX *in_RSI;
  long in_FS_OFFSET;
  QSQLiteResult *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QSQLiteResult_00227a40;
  this_00 = *(QSQLiteResultPrivate **)&this->field_0x8;
  pQVar1 = QSQLiteResultPrivate::drv_d_func(this_00);
  if (pQVar1 != (QSQLiteDriverPrivate *)0x0) {
    pQVar1 = QSQLiteResultPrivate::drv_d_func(this_00);
    in_RSI = (EVP_PKEY_CTX *)&local_20;
    local_20 = this;
    QtPrivate::sequential_erase_one<QList<QSQLiteResult*>,QSQLiteResult*>
              (&pQVar1->results,(QSQLiteResult **)in_RSI);
  }
  QSQLiteResultPrivate::cleanup(this_00,in_RSI);
  QSqlResult::~QSqlResult((QSqlResult *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSQLiteResult::~QSQLiteResult()
{
    Q_D(QSQLiteResult);
    if (d->drv_d_func())
        const_cast<QSQLiteDriverPrivate*>(d->drv_d_func())->results.removeOne(this);
    d->cleanup();
}